

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O3

int generate_by_miniscript_crypto
              (miniscript_node_t *node,miniscript_node_t *parent,int32_t derive_child_num,
              uchar crypto_op_code,uchar crypto_size,uchar *script,size_t script_len,
              size_t *write_len)

{
  int iVar1;
  ulong uVar2;
  size_t local_30;
  
  local_30 = *write_len;
  uVar2 = 0x208;
  if (script_len < 0x208) {
    uVar2 = script_len;
  }
  iVar1 = -2;
  if (((node->child != (miniscript_node_t *)0x0) && ((ulong)crypto_size + 8 <= script_len)) &&
     ((parent == (miniscript_node_t *)0x0 || (parent->info != (miniscript_item_t *)0x0)))) {
    iVar1 = generate_script_from_miniscript
                      (node->child,node,derive_child_num,script + 6,script_len - 8,&local_30);
    if (iVar1 == 0) {
      iVar1 = -2;
      if (local_30 + 7 <= uVar2) {
        script[0] = 0x82;
        script[1] = '\x01';
        script[2] = ' ';
        script[3] = 0x88;
        script[4] = crypto_op_code;
        script[5] = crypto_size;
        script[local_30 + 6] = 0x87;
        *write_len = local_30 + 7;
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

static int generate_by_miniscript_crypto(
    struct miniscript_node_t *node,
    struct miniscript_node_t *parent,
    int32_t derive_child_num,
    unsigned char crypto_op_code,
    unsigned char crypto_size,
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    int ret;
    size_t child_write_len = *write_len;
    size_t check_len = (DESCRIPTOR_REDEEM_SCRIPT_MAX_SIZE > script_len) ?
                       script_len : DESCRIPTOR_REDEEM_SCRIPT_MAX_SIZE;

    if (!node->child || (script_len < (size_t)(crypto_size + 8)) || (parent && !parent->info))
        return WALLY_EINVAL;

    ret = generate_script_from_miniscript(node->child, node, derive_child_num,
                                          &script[6], script_len - 8, &child_write_len);
    if (ret != WALLY_OK)
        return ret;

    if (child_write_len + 7 > check_len)
        return WALLY_EINVAL;

    script[0] = OP_SIZE;
    script[1] = 0x01;
    script[2] = 0x20;
    script[3] = OP_EQUALVERIFY;
    script[4] = crypto_op_code;
    script[5] = crypto_size;
    script[child_write_len + 6] = OP_EQUAL;
    *write_len = child_write_len + 7;
    return ret;
}